

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool NavScoreItem(ImGuiNavMoveResult *result,ImRect cand)

{
  ImGuiNavLayer IVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  ulong uVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  uint uVar8;
  ImRect *pIVar9;
  long lVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined4 uVar14;
  undefined1 auVar13 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  ImVec2 IVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  ImVec2 local_28;
  undefined8 local_18;
  
  pIVar6 = GImGui;
  local_28 = cand.Max;
  auVar12._0_8_ = cand.Min;
  auVar12._8_8_ = cand.Min;
  pIVar3 = GImGui->CurrentWindow;
  IVar1 = GImGui->NavLayer;
  if (IVar1 != (pIVar3->DC).NavLayerCurrent) {
    return false;
  }
  GImGui->NavScoringCount = GImGui->NavScoringCount + 1;
  pIVar4 = pIVar6->NavWindow;
  if (pIVar3->ParentWindow == pIVar4) {
    if (((uint)(pIVar4->Flags | pIVar3->Flags) >> 0x17 & 1) == 0) {
      __assert_fail("(window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0x1cd3,"bool NavScoreItem(ImGuiNavMoveResult *, ImRect)");
    }
    fVar11 = (pIVar3->ClipRect).Min.x;
    fVar15 = cand.Min.x;
    if (fVar15 < fVar11) {
      return false;
    }
    fVar17 = cand.Min.y;
    if (fVar17 < (pIVar3->ClipRect).Min.y) {
      return false;
    }
    fVar21 = cand.Max.x;
    if ((pIVar3->ClipRect).Max.x < fVar21) {
      return false;
    }
    fVar16 = cand.Max.y;
    if ((pIVar3->ClipRect).Max.y < fVar16) {
      return false;
    }
    fVar18 = (pIVar3->ClipRect).Min.y;
    IVar20 = (pIVar3->ClipRect).Max;
    fVar19 = IVar20.x;
    fVar23 = fVar18;
    fVar24 = 0.0;
    if ((fVar18 <= fVar17) && (fVar23 = IVar20.y, fVar24 = IVar20.y, fVar17 <= IVar20.y)) {
      fVar23 = fVar17;
    }
    fVar22 = fVar19;
    if (fVar15 <= fVar19) {
      fVar22 = fVar15;
    }
    uVar5 = (ulong)(-(uint)(fVar15 < fVar11) & (uint)fVar11) |
            CONCAT44(~(uint)fVar17 & (uint)IVar20.y,~-(uint)(fVar15 < fVar11) & (uint)fVar22);
    if ((fVar18 <= fVar16) && (fVar18 = IVar20.y, fVar16 <= IVar20.y)) {
      fVar18 = fVar16;
    }
    auVar13._8_4_ = ~(uint)fVar17 & (uint)IVar20.y;
    auVar13._0_8_ = uVar5;
    auVar13._12_4_ = fVar24;
    auVar12._8_8_ = auVar13._8_8_;
    auVar12._0_4_ = (undefined4)uVar5;
    auVar12._4_4_ = fVar23;
    if (fVar21 <= fVar19) {
      IVar20.x = fVar21;
    }
    local_28.y = fVar18;
    local_28.x = (float)(-(uint)(fVar21 < fVar11) & (uint)fVar11 |
                        ~-(uint)(fVar21 < fVar11) & (uint)IVar20.x);
  }
  local_18 = auVar12._0_8_;
  bVar7 = 1 < (uint)pIVar6->NavMoveClipDir;
  uVar14 = auVar12._4_4_;
  if (bVar7) {
    pIVar9 = &pIVar3->ClipRect;
    lVar10 = 0x208;
  }
  else {
    auVar12._4_4_ = uVar14;
    auVar12._0_4_ = uVar14;
    auVar12._8_4_ = uVar14;
    auVar12._12_4_ = uVar14;
    pIVar9 = (ImRect *)&(pIVar3->ClipRect).Min.y;
    lVar10 = 0x20c;
  }
  bVar7 = !bVar7;
  fVar11 = (pIVar9->Min).x;
  fVar15 = *(float *)((long)&pIVar3->Name + lVar10);
  fVar21 = auVar12._0_4_;
  fVar17 = fVar15;
  if (fVar21 <= fVar15) {
    fVar17 = fVar21;
  }
  uVar5 = (ulong)bVar7;
  *(uint *)((long)&local_18 + uVar5 * 4) =
       -(uint)(fVar21 < fVar11) & (uint)fVar11 | ~-(uint)(fVar21 < fVar11) & (uint)fVar17;
  fVar17 = (&local_28.x)[bVar7];
  if (fVar17 <= fVar15) {
    fVar15 = fVar17;
  }
  (&local_28.x)[uVar5] =
       (float)(-(uint)(fVar17 < fVar11) & (uint)fVar11 | ~-(uint)(fVar17 < fVar11) & (uint)fVar15);
  fVar11 = (pIVar6->NavScoringRectScreen).Min.x;
  fVar15 = (pIVar6->NavScoringRectScreen).Max.x;
  if (fVar11 <= local_28.x) {
    fVar17 = 0.0;
    if (fVar15 < (float)local_18) {
      fVar17 = (float)local_18 - fVar15;
    }
  }
  else {
    fVar17 = local_28.x - fVar11;
  }
  fVar18 = (local_28.y - local_18._4_4_) * 0.8 + local_18._4_4_;
  fVar21 = (pIVar6->NavScoringRectScreen).Min.y;
  fVar16 = (pIVar6->NavScoringRectScreen).Max.y;
  fVar23 = fVar16 - fVar21;
  fVar24 = fVar23 * 0.2 + fVar21;
  if (fVar24 <= fVar18) {
    fVar24 = (local_28.y - local_18._4_4_) * 0.2 + local_18._4_4_;
    fVar23 = fVar23 * 0.8 + fVar21;
    fVar18 = 0.0;
    if (fVar23 < fVar24) {
      fVar18 = fVar24 - fVar23;
    }
  }
  else {
    fVar18 = fVar18 - fVar24;
  }
  if (((fVar17 != 0.0) || (NAN(fVar17))) && ((fVar18 != 0.0 || (NAN(fVar18))))) {
    fVar17 = fVar17 / 1000.0 + *(float *)(&DAT_00199a68 + (ulong)(0.0 < fVar17) * 4);
  }
  fVar23 = ABS(fVar18) + ABS(fVar17);
  fVar11 = (local_28.x + (float)local_18) - (fVar11 + fVar15);
  fVar15 = (local_28.y + local_18._4_4_) - (fVar21 + fVar16);
  fVar21 = ABS(fVar11) + ABS(fVar15);
  if ((fVar18 != 0.0) || (NAN(fVar18))) {
LAB_00132699:
    fVar16 = fVar23;
    uVar8 = (uint)(0.0 < fVar17);
    fVar11 = fVar17;
    fVar15 = fVar18;
    if (ABS(fVar17) <= ABS(fVar18)) {
      uVar8 = 0.0 < fVar18 | 2;
    }
  }
  else {
    if ((fVar17 != 0.0) || (NAN(fVar17))) goto LAB_00132699;
    if ((((fVar11 != 0.0) || (NAN(fVar11))) || (fVar15 != 0.0)) || (NAN(fVar15))) {
      fVar16 = fVar21;
      uVar8 = (uint)(0.0 < fVar11);
      if (ABS(fVar11) <= ABS(fVar15)) {
        uVar8 = 0.0 < fVar15 | 2;
      }
    }
    else {
      fVar16 = 0.0;
      uVar8 = (uint)(pIVar6->NavId <= (pIVar3->DC).LastItemId);
      fVar11 = 0.0;
      fVar15 = 0.0;
    }
  }
  uVar2 = pIVar6->NavMoveDir;
  if (uVar8 == uVar2) {
    fVar24 = result->DistBox;
    if (fVar23 < fVar24) {
      result->DistBox = fVar23;
      result->DistCenter = fVar21;
      return true;
    }
    if ((fVar23 == fVar24) && (!NAN(fVar23) && !NAN(fVar24))) {
      fVar23 = result->DistCenter;
      if (fVar21 < fVar23) {
        result->DistCenter = fVar21;
LAB_0013273e:
        bVar7 = true;
        goto LAB_00132744;
      }
      if ((fVar21 == fVar23) && (!NAN(fVar21) && !NAN(fVar23))) {
        if ((uVar2 & 0xfffffffe) != 2) {
          fVar18 = fVar17;
        }
        if (fVar18 < 0.0) goto LAB_0013273e;
      }
    }
  }
  bVar7 = false;
LAB_00132744:
  if (result->DistBox != 3.4028235e+38) {
    return bVar7;
  }
  if (NAN(result->DistBox)) {
    return bVar7;
  }
  if (IVar1 != ImGuiNavLayer_Menu) {
    return bVar7;
  }
  if (fVar16 < result->DistAxial) {
    if ((pIVar4->Flags & 0x10000000) != 0) {
      return bVar7;
    }
    if (((0.0 <= fVar11 || uVar2 != 0) && (fVar11 <= 0.0 || uVar2 != 1)) &&
       ((uVar2 != 2 || (0.0 <= fVar15)))) {
      if (uVar2 != 3) {
        return bVar7;
      }
      if (fVar15 <= 0.0) {
        return bVar7;
      }
    }
    result->DistAxial = fVar16;
    return true;
  }
  return bVar7;
}

Assistant:

static bool NavScoreItem(ImGuiNavMoveResult* result, ImRect cand)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavLayer != window->DC.NavLayerCurrent)
        return false;

    const ImRect& curr = g.NavScoringRectScreen; // Current modified source rect (NB: we've applied Max.x = Min.x in NavUpdate() to inhibit the effect of having varied item width)
    g.NavScoringCount++;

    // When entering through a NavFlattened border, we consider child window items as fully clipped for scoring
    if (window->ParentWindow == g.NavWindow)
    {
        IM_ASSERT((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened);
        if (!window->ClipRect.Contains(cand))
            return false;
        cand.ClipWithFull(window->ClipRect); // This allows the scored item to not overlap other candidates in the parent window
    }

    // We perform scoring on items bounding box clipped by the current clipping rectangle on the other axis (clipping on our movement axis would give us equal scores for all clipped items)
    // For example, this ensure that items in one column are not reached when moving vertically from items in another column.
    NavClampRectToVisibleAreaForMoveDir(g.NavMoveClipDir, cand, window->ClipRect);

    // Compute distance between boxes
    // FIXME-NAV: Introducing biases for vertical navigation, needs to be removed.
    float dbx = NavScoreItemDistInterval(cand.Min.x, cand.Max.x, curr.Min.x, curr.Max.x);
    float dby = NavScoreItemDistInterval(ImLerp(cand.Min.y, cand.Max.y, 0.2f), ImLerp(cand.Min.y, cand.Max.y, 0.8f), ImLerp(curr.Min.y, curr.Max.y, 0.2f), ImLerp(curr.Min.y, curr.Max.y, 0.8f)); // Scale down on Y to keep using box-distance for vertically touching items
    if (dby != 0.0f && dbx != 0.0f)
       dbx = (dbx/1000.0f) + ((dbx > 0.0f) ? +1.0f : -1.0f);
    float dist_box = ImFabs(dbx) + ImFabs(dby);

    // Compute distance between centers (this is off by a factor of 2, but we only compare center distances with each other so it doesn't matter)
    float dcx = (cand.Min.x + cand.Max.x) - (curr.Min.x + curr.Max.x);
    float dcy = (cand.Min.y + cand.Max.y) - (curr.Min.y + curr.Max.y);
    float dist_center = ImFabs(dcx) + ImFabs(dcy); // L1 metric (need this for our connectedness guarantee)

    // Determine which quadrant of 'curr' our candidate item 'cand' lies in based on distance
    ImGuiDir quadrant;
    float dax = 0.0f, day = 0.0f, dist_axial = 0.0f;
    if (dbx != 0.0f || dby != 0.0f)
    {
        // For non-overlapping boxes, use distance between boxes
        dax = dbx;
        day = dby;
        dist_axial = dist_box;
        quadrant = ImGetDirQuadrantFromDelta(dbx, dby);
    }
    else if (dcx != 0.0f || dcy != 0.0f)
    {
        // For overlapping boxes with different centers, use distance between centers
        dax = dcx;
        day = dcy;
        dist_axial = dist_center;
        quadrant = ImGetDirQuadrantFromDelta(dcx, dcy);
    }
    else
    {
        // Degenerate case: two overlapping buttons with same center, break ties arbitrarily (note that LastItemId here is really the _previous_ item order, but it doesn't matter)
        quadrant = (window->DC.LastItemId < g.NavId) ? ImGuiDir_Left : ImGuiDir_Right;
    }

#if IMGUI_DEBUG_NAV_SCORING
    char buf[128];
    if (ImGui::IsMouseHoveringRect(cand.Min, cand.Max))
    {
        ImFormatString(buf, IM_ARRAYSIZE(buf), "dbox (%.2f,%.2f->%.4f)\ndcen (%.2f,%.2f->%.4f)\nd (%.2f,%.2f->%.4f)\nnav %c, quadrant %c", dbx, dby, dist_box, dcx, dcy, dist_center, dax, day, dist_axial, "WENS"[g.NavMoveDir], "WENS"[quadrant]);
        ImDrawList* draw_list = ImGui::GetForegroundDrawList(window);
        draw_list->AddRect(curr.Min, curr.Max, IM_COL32(255,200,0,100));
        draw_list->AddRect(cand.Min, cand.Max, IM_COL32(255,255,0,200));
        draw_list->AddRectFilled(cand.Max-ImVec2(4,4), cand.Max+ImGui::CalcTextSize(buf)+ImVec2(4,4), IM_COL32(40,0,0,150));
        draw_list->AddText(g.IO.FontDefault, 13.0f, cand.Max, ~0U, buf);
    }
    else if (g.IO.KeyCtrl) // Hold to preview score in matching quadrant. Press C to rotate.
    {
        if (ImGui::IsKeyPressedMap(ImGuiKey_C)) { g.NavMoveDirLast = (ImGuiDir)((g.NavMoveDirLast + 1) & 3); g.IO.KeysDownDuration[g.IO.KeyMap[ImGuiKey_C]] = 0.01f; }
        if (quadrant == g.NavMoveDir)
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "%.0f/%.0f", dist_box, dist_center);
            ImDrawList* draw_list = ImGui::GetForegroundDrawList(window);
            draw_list->AddRectFilled(cand.Min, cand.Max, IM_COL32(255, 0, 0, 200));
            draw_list->AddText(g.IO.FontDefault, 13.0f, cand.Min, IM_COL32(255, 255, 255, 255), buf);
        }
    }
 #endif

    // Is it in the quadrant we're interesting in moving to?
    bool new_best = false;
    if (quadrant == g.NavMoveDir)
    {
        // Does it beat the current best candidate?
        if (dist_box < result->DistBox)
        {
            result->DistBox = dist_box;
            result->DistCenter = dist_center;
            return true;
        }
        if (dist_box == result->DistBox)
        {
            // Try using distance between center points to break ties
            if (dist_center < result->DistCenter)
            {
                result->DistCenter = dist_center;
                new_best = true;
            }
            else if (dist_center == result->DistCenter)
            {
                // Still tied! we need to be extra-careful to make sure everything gets linked properly. We consistently break ties by symbolically moving "later" items
                // (with higher index) to the right/downwards by an infinitesimal amount since we the current "best" button already (so it must have a lower index),
                // this is fairly easy. This rule ensures that all buttons with dx==dy==0 will end up being linked in order of appearance along the x axis.
                if (((g.NavMoveDir == ImGuiDir_Up || g.NavMoveDir == ImGuiDir_Down) ? dby : dbx) < 0.0f) // moving bj to the right/down decreases distance
                    new_best = true;
            }
        }
    }

    // Axial check: if 'curr' has no link at all in some direction and 'cand' lies roughly in that direction, add a tentative link. This will only be kept if no "real" matches
    // are found, so it only augments the graph produced by the above method using extra links. (important, since it doesn't guarantee strong connectedness)
    // This is just to avoid buttons having no links in a particular direction when there's a suitable neighbor. you get good graphs without this too.
    // 2017/09/29: FIXME: This now currently only enabled inside menu bars, ideally we'd disable it everywhere. Menus in particular need to catch failure. For general navigation it feels awkward.
    // Disabling it may lead to disconnected graphs when nodes are very spaced out on different axis. Perhaps consider offering this as an option?
    if (result->DistBox == FLT_MAX && dist_axial < result->DistAxial)  // Check axial match
        if (g.NavLayer == 1 && !(g.NavWindow->Flags & ImGuiWindowFlags_ChildMenu))
            if ((g.NavMoveDir == ImGuiDir_Left && dax < 0.0f) || (g.NavMoveDir == ImGuiDir_Right && dax > 0.0f) || (g.NavMoveDir == ImGuiDir_Up && day < 0.0f) || (g.NavMoveDir == ImGuiDir_Down && day > 0.0f))
            {
                result->DistAxial = dist_axial;
                new_best = true;
            }

    return new_best;
}